

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForcePlateInfo.h
# Opt level: O2

void __thiscall ViconCGStream::VForcePlateInfo::Write(VForcePlateInfo *this,VBuffer *i_rBuffer)

{
  ViconCGStreamIO::VBufferImpl::WritePod<unsigned_int>(&i_rBuffer->m_BufferImpl,&this->m_DeviceID);
  ViconCGStreamIO::VBuffer::Write<float,3u>(i_rBuffer,&this->m_WorldTranslation);
  ViconCGStreamIO::VBuffer::Write<float,9u>(i_rBuffer,&this->m_WorldRotation);
  ViconCGStreamIO::VBuffer::Write<float,6u>(i_rBuffer,&this->m_Bounds);
  ViconCGStreamIO::VBuffer::Write<float,3u>(i_rBuffer,&this->m_LocalTranslation);
  ViconCGStreamIO::VBuffer::Write<float,9u>(i_rBuffer,&this->m_LocalRotation);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_DeviceID );
    i_rBuffer.Write( m_WorldTranslation );
    i_rBuffer.Write( m_WorldRotation );
    i_rBuffer.Write( m_Bounds );
    i_rBuffer.Write( m_LocalTranslation );
    i_rBuffer.Write( m_LocalRotation );
  }